

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int VmHashConstStep(SyHashEntry *pEntry,void *pUserData)

{
  int iVar1;
  undefined1 local_60 [4];
  sxi32 rc;
  jx9_value sName;
  jx9_value *pArray;
  void *pUserData_local;
  SyHashEntry *pEntry_local;
  
  sName._56_8_ = pUserData;
  jx9MemObjInitFromString
            (*(jx9_vm **)((long)pUserData + 0x10),(jx9_value *)local_60,(SyString *)0x0);
  jx9MemObjStringAppend((jx9_value *)local_60,(char *)pEntry->pKey,pEntry->nKeyLen);
  iVar1 = jx9_array_add_elem((jx9_value *)sName._56_8_,(jx9_value *)0x0,(jx9_value *)local_60);
  jx9MemObjRelease((jx9_value *)local_60);
  return iVar1;
}

Assistant:

static int VmHashConstStep(SyHashEntry *pEntry, void *pUserData)
{
	jx9_value *pArray = (jx9_value *)pUserData;
	jx9_value sName;
	sxi32 rc;
	/* Prepare the constant name for insertion */
	jx9MemObjInitFromString(pArray->pVm, &sName, 0);
	jx9MemObjStringAppend(&sName, (const char *)pEntry->pKey, pEntry->nKeyLen);
	/* Perform the insertion */
	rc = jx9_array_add_elem(pArray, 0, &sName); /* Will make it's own copy */
	jx9MemObjRelease(&sName);
	return rc;
}